

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O3

int IDABBDPrecFree(IDAMem IDA_mem)

{
  void *__ptr;
  
  if ((IDA_mem->ida_lmem != (void *)0x0) &&
     (__ptr = *(void **)((long)IDA_mem->ida_lmem + 0x118), __ptr != (void *)0x0)) {
    SUNLinSolFree(*(undefined8 *)((long)__ptr + 0x48));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x58));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x50));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x60));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x68));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x70));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x78));
    SUNMatDestroy(*(undefined8 *)((long)__ptr + 0x40));
    free(__ptr);
  }
  return 0;
}

Assistant:

static int IDABBDPrecFree(IDAMem IDA_mem)
{
  IDALsMem idals_mem;
  IBBDPrecData pdata;

  if (IDA_mem->ida_lmem == NULL) { return (0); }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  if (idals_mem->pdata == NULL) { return (0); }
  pdata = (IBBDPrecData)idals_mem->pdata;

  SUNLinSolFree(pdata->LS);
  N_VDestroy(pdata->rlocal);
  N_VDestroy(pdata->zlocal);
  N_VDestroy(pdata->tempv1);
  N_VDestroy(pdata->tempv2);
  N_VDestroy(pdata->tempv3);
  N_VDestroy(pdata->tempv4);
  SUNMatDestroy(pdata->PP);

  free(pdata);
  pdata = NULL;

  return (0);
}